

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O3

int run_test_get_currentexe(void)

{
  int iVar1;
  __uid_t _Var2;
  __gid_t _Var3;
  char *pcVar4;
  anon_union_8_2_bf76bca6_for_active_reqs aVar5;
  anon_union_8_2_bf76bca6_for_active_reqs aVar6;
  undefined8 uVar7;
  anon_union_8_2_bf76bca6_for_active_reqs aVar8;
  anon_union_8_2_bf76bca6_for_active_reqs extraout_RAX;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  char *unaff_RBX;
  int iVar9;
  uv_getaddrinfo_t *__ptr;
  char *unaff_R14;
  anon_union_8_2_bf76bca6_for_active_reqs aVar10;
  undefined1 auStack_2378 [24];
  void *pvStack_2360;
  undefined1 auStack_2358 [144];
  undefined8 uStack_22c8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_22b8;
  undefined8 uStack_22a8;
  code *pcStack_22a0;
  long lStack_2298;
  long lStack_2290;
  undefined1 auStack_2288 [160];
  anon_union_8_2_bf76bca6_for_active_reqs aStack_21e8;
  size_t sStack_21d8;
  size_t sStack_21d0;
  char *pcStack_21c8;
  size_t sStack_21c0;
  undefined1 auStack_21b0 [16];
  ulong uStack_21a0;
  char *pcStack_2198;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2190;
  char *pcStack_2188;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2180;
  size_t sStack_2170;
  long lStack_2168;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2160;
  long lStack_2158;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2148;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2140;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2130;
  undefined4 uStack_2128;
  undefined4 uStack_2124;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2118;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2110;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2100;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20f8;
  anon_union_8_2_bf76bca6_for_active_reqs *paStack_20f0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20e8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20e0;
  anon_union_8_2_bf76bca6_for_active_reqs *paStack_20d8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20d0;
  char *pcStack_20c8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20c0;
  long lStack_20b8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20b0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20a0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2098;
  uv_handle_t **ppuStack_2090;
  uv_handle_t *puStack_2060;
  char *pcStack_2058;
  char *pcStack_2050;
  char *pcStack_2048;
  char *pcStack_2040;
  int64_t eval_b;
  int64_t eval_a;
  size_t size;
  char buffer [4096];
  char path [4096];
  
  size = 0x1000;
  pcStack_2040 = (char *)0x19c054;
  iVar1 = uv_exepath(buffer);
  if (iVar1 == 0) {
    pcStack_2040 = (char *)0x19c070;
    pcVar4 = realpath(executable_path,path);
    if (pcVar4 == (char *)0x0) goto LAB_0019c38d;
    pcStack_2040 = (char *)0x19c08b;
    pcVar4 = strstr(buffer,path);
    if (pcVar4 == (char *)0x0) {
LAB_0019c383:
      pcStack_2040 = (char *)0x19c388;
      run_test_get_currentexe_cold_17();
      goto LAB_0019c388;
    }
    pcStack_2040 = (char *)0x19c0a4;
    iVar1 = strcmp(pcVar4,path);
    if (iVar1 != 0) goto LAB_0019c383;
    eval_a = size;
    pcStack_2040 = (char *)0x19c0c0;
    eval_b = strlen(buffer);
    if (eval_a != eval_b) goto LAB_0019c392;
    size = 0x1000;
    pcStack_2040 = (char *)0x19c0e8;
    iVar1 = uv_exepath(0);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a != -0x16) goto LAB_0019c3a1;
    pcStack_2040 = (char *)0x19c114;
    iVar1 = uv_exepath(buffer,0);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a != -0x16) goto LAB_0019c3b0;
    size = 0;
    pcStack_2040 = (char *)0x19c14a;
    iVar1 = uv_exepath(buffer);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a != -0x16) goto LAB_0019c3bf;
    unaff_RBX = buffer;
    pcStack_2040 = (char *)0x19c181;
    memset(unaff_RBX,0xff,0x1000);
    size = 1;
    pcStack_2040 = (char *)0x19c195;
    iVar1 = uv_exepath(unaff_RBX);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c3ce;
    eval_a = size;
    eval_b = 0;
    if (size != 0) goto LAB_0019c3dd;
    eval_a = (int64_t)buffer[0];
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c3ec;
    unaff_RBX = buffer;
    pcStack_2040 = (char *)0x19c213;
    memset(unaff_RBX,0xff,0x1000);
    size = 2;
    pcStack_2040 = (char *)0x19c227;
    iVar1 = uv_exepath(unaff_RBX);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c3fb;
    eval_a = 1;
    eval_b = size;
    if (size != 1) goto LAB_0019c40a;
    eval_a = (int64_t)buffer[0];
    eval_b = 0;
    if (eval_a == 0) goto LAB_0019c419;
    eval_a = (int64_t)buffer[1];
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c428;
    pcStack_2040 = (char *)0x19c2be;
    iVar1 = uv_set_process_title("foobar");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c437;
    size = 0x1000;
    pcStack_2040 = (char *)0x19c2f4;
    iVar1 = uv_exepath(buffer);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c446;
    pcStack_2040 = (char *)0x19c326;
    pcVar4 = strstr(buffer,path);
    if (pcVar4 != (char *)0x0) {
      unaff_R14 = path;
      pcStack_2040 = (char *)0x19c345;
      iVar1 = strcmp(pcVar4,unaff_R14);
      if (iVar1 != 0) goto LAB_0019c45a;
      eval_a = size;
      pcStack_2040 = (char *)0x19c361;
      eval_b = strlen(buffer);
      if (eval_a == eval_b) {
        return 0;
      }
      pcStack_2040 = (char *)0x19c4b2;
      run_test_get_currentexe_cold_14();
      puStack_2060 = (uv_handle_t *)0xbff0000000000000;
      pcStack_2058 = (char *)0xbff0000000000000;
      pcStack_2050 = (char *)0xbff0000000000000;
      pcStack_2040 = pcVar4;
      uv_loadavg(&puStack_2060);
      if ((long)(double)puStack_2060 < 0) {
        run_test_get_loadavg_cold_3();
LAB_0019c54e:
        run_test_get_loadavg_cold_2();
      }
      else {
        if ((long)(double)pcStack_2058 < 0) goto LAB_0019c54e;
        if (-1 < (long)(double)pcStack_2050) {
          return 0;
        }
      }
      run_test_get_loadavg_cold_1();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c578;
      ppuStack_2090 = &puStack_2060;
      aVar5.unused = (void *)uv_get_free_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c580;
      aVar6.unused = (void *)uv_get_total_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c588;
      uVar7 = uv_get_constrained_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c590;
      aVar8.unused = (void *)uv_get_available_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c5ad;
      printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, available_mem=%llu\n",
             aVar5.unused,aVar6.unused,uVar7,aVar8.unused);
      aStack_20a0.unused = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
      if ((long)aVar5.unused < 1) {
        aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c62a;
        aStack_2098.unused = aVar5.unused;
        run_test_get_memory_cold_1();
LAB_0019c62a:
        aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c639;
        run_test_get_memory_cold_2();
LAB_0019c639:
        aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c648;
        run_test_get_memory_cold_3();
      }
      else {
        aStack_20a0.unused = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        aStack_2098.unused = aVar6.unused;
        if ((long)aVar6.unused < 1) goto LAB_0019c62a;
        aStack_20a0.unused = aVar5.unused;
        if ((long)aVar6.unused <= (long)aVar5.unused) goto LAB_0019c639;
        aStack_20a0.unused = aVar6.unused;
        aStack_2098.unused = aVar8.unused;
        if ((long)aVar8.unused <= (long)aVar6.unused) {
          return 0;
        }
      }
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c657;
      run_test_get_memory_cold_4();
      aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c667;
      aStack_20b0.unused = aVar6.unused;
      iVar1 = uv_os_get_passwd(&aStack_20e0);
      aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
      paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused ==
          (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c68f;
        aStack_20e8.unused = (void *)strlen(aStack_20e0.unused);
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        if ((long)aStack_20e8.unused < 1) goto LAB_0019c8a6;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c6b5;
        aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)strlen(pcStack_20c8);
        aVar8 = aStack_20c0;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        if ((long)aStack_20e8.unused < 1) goto LAB_0019c8b3;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c6de;
        aStack_20e8.unused = (void *)strlen(aStack_20c0.unused);
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        aVar6 = aVar8;
        if ((long)aStack_20e8.unused < 1) goto LAB_0019c8c0;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused !=
            (anon_union_8_2_bf76bca6_for_active_reqs *)0x1) {
LAB_0019c729:
          aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)
                        (long)*(char *)((long)aVar8.unused + ((long)aStack_20e8.unused - 1U));
          paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused !=
              (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f) goto LAB_0019c74b;
          goto LAB_0019c929;
        }
        aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)*aVar8.unused;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f;
        if (aStack_20e8.unused != (void *)0x2f) {
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c729;
          run_test_get_passwd_cold_6();
          aStack_20e8 = extraout_RAX;
          goto LAB_0019c729;
        }
LAB_0019c74b:
        aStack_20e8.unused = paStack_20d8;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff;
        if (paStack_20d8 == (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff)
        goto LAB_0019c8cd;
        aStack_20e8.unused = aStack_20d0.unused;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20d0.unused ==
            (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff) goto LAB_0019c8da;
        aStack_20e8.unused = paStack_20d8;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c794;
        _Var2 = geteuid();
        aVar8 = aStack_20d0;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var2;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused != paStack_20f0)
        goto LAB_0019c8e7;
        if (paStack_20d8 == (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
LAB_0019c7e6:
          aVar8.unused = &aStack_20e0;
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c7f3;
          uv_os_free_passwd(aVar8.unused);
          if ((char *)aStack_20e0.unused != (char *)0x0) goto LAB_0019c8f4;
          if (pcStack_20c8 != (char *)0x0) goto LAB_0019c8f9;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20c0.unused !=
              (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) goto LAB_0019c8fe;
          if (lStack_20b8 != 0) goto LAB_0019c903;
          aVar8.unused = &aStack_20e0;
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c836;
          uv_os_free_passwd(aVar8.unused);
          if ((char *)aStack_20e0.unused != (char *)0x0) goto LAB_0019c908;
          if (pcStack_20c8 != (char *)0x0) goto LAB_0019c90d;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20c0.unused !=
              (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) goto LAB_0019c912;
          if (lStack_20b8 != 0) goto LAB_0019c917;
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c873;
          iVar1 = uv_os_get_passwd(0);
          aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
          paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffffffffffea;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused ==
              (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffffffffffea) {
            return 0;
          }
          goto LAB_0019c91c;
        }
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c7bb;
        _Var3 = getgid();
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aVar8.unused ==
            (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var3) goto LAB_0019c7e6;
        aStack_20e8.unused = aStack_20d0.unused;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c7d1;
        _Var3 = getegid();
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var3;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused == paStack_20f0)
        goto LAB_0019c7e6;
      }
      else {
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8a6;
        run_test_get_passwd_cold_1();
LAB_0019c8a6:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8b3;
        run_test_get_passwd_cold_2();
LAB_0019c8b3:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8c0;
        run_test_get_passwd_cold_3();
LAB_0019c8c0:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8cd;
        run_test_get_passwd_cold_4();
LAB_0019c8cd:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8da;
        run_test_get_passwd_cold_19();
LAB_0019c8da:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8e7;
        run_test_get_passwd_cold_18();
LAB_0019c8e7:
        aVar8 = aVar6;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8f4;
        run_test_get_passwd_cold_7();
LAB_0019c8f4:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8f9;
        run_test_get_passwd_cold_9();
LAB_0019c8f9:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8fe;
        run_test_get_passwd_cold_10();
LAB_0019c8fe:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c903;
        run_test_get_passwd_cold_11();
LAB_0019c903:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c908;
        run_test_get_passwd_cold_12();
LAB_0019c908:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c90d;
        run_test_get_passwd_cold_13();
LAB_0019c90d:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c912;
        run_test_get_passwd_cold_14();
LAB_0019c912:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c917;
        run_test_get_passwd_cold_15();
LAB_0019c917:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c91c;
        run_test_get_passwd_cold_16();
LAB_0019c91c:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c929;
        run_test_get_passwd_cold_17();
LAB_0019c929:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c936;
        run_test_get_passwd_cold_5();
      }
      aStack_20f8.unused = run_test_get_passwd2;
      run_test_get_passwd_cold_8();
      aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c954;
      aStack_2100 = aVar8;
      aStack_20f8.unused = aVar5.unused;
      iVar1 = uv_os_get_passwd(&aStack_2130);
      aStack_2160 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
      sStack_2170 = 0;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_2160.unused ==
          (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c982;
        iVar1 = uv_os_get_passwd2(&aStack_2160,uStack_2128);
        aVar6 = aStack_2160;
        sStack_2170 = (size_t)iVar1;
        lStack_2168 = 0;
        if (sStack_2170 != 0) goto LAB_0019cb40;
        sStack_2170 = CONCAT44(uStack_2124,uStack_2128);
        lStack_2168 = lStack_2158;
        if (sStack_2170 != lStack_2158) goto LAB_0019cb4f;
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c9db;
        iVar1 = strcmp((char *)aStack_2130.unused,(char *)aStack_2160.unused);
        aVar10 = aStack_2148;
        aVar8 = aStack_2130;
        aVar5 = aVar6;
        if (iVar1 == 0) {
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c9f8;
          iVar1 = strcmp((char *)aStack_2118.unused,(char *)aStack_2148.unused);
          aVar6 = aStack_2140;
          if (iVar1 != 0) {
            pcStack_2198 = "pwd2.shell";
            pcVar4 = "pwd.shell";
            uVar7 = 0x83;
            aStack_2110 = aStack_2118;
            goto LAB_0019cbf8;
          }
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca15;
          iVar1 = strcmp((char *)aStack_2110.unused,(char *)aStack_2140.unused);
          if (iVar1 != 0) {
            pcStack_2198 = "pwd2.homedir";
            pcVar4 = "pwd.homedir";
            uVar7 = 0x84;
            aVar10 = aVar6;
            goto LAB_0019cbf8;
          }
          aVar6.unused = &aStack_2160;
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca2a;
          uv_os_free_passwd(aVar6.unused);
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca34;
          iVar1 = uv_os_get_passwd2(aVar6.unused,0);
          aVar5 = aStack_2160;
          sStack_2170 = (size_t)iVar1;
          lStack_2168 = 0;
          if (sStack_2170 == 0) {
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca61;
            sStack_2170 = strlen((char *)aStack_2160.unused);
            lStack_2168 = 0;
            aVar6 = aVar5;
            if ((long)sStack_2170 < 1) goto LAB_0019cc1e;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca8e;
            iVar1 = strcmp((char *)aVar5.unused,"root");
            if (iVar1 != 0) goto LAB_0019cc2d;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19caa0;
            sStack_2170 = strlen((char *)aStack_2140.unused);
            lStack_2168 = 0;
            if ((long)sStack_2170 < 1) goto LAB_0019cc35;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cac8;
            sStack_2170 = strlen((char *)aStack_2148.unused);
            lStack_2168 = 0;
            if ((long)sStack_2170 < 1) goto LAB_0019cc44;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19caf0;
            uv_os_free_passwd(&aStack_2160);
            aVar6.unused = &aStack_2130;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cafd;
            uv_os_free_passwd(aVar6.unused);
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb07;
            iVar1 = uv_os_get_passwd2(0,uStack_2128);
            sStack_2170 = (size_t)iVar1;
            lStack_2168 = 0xffffffffffffffea;
            if (sStack_2170 == 0xffffffffffffffea) {
              return 0;
            }
          }
          else {
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc1e;
            run_test_get_passwd2_cold_4();
LAB_0019cc1e:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc2d;
            run_test_get_passwd2_cold_5();
LAB_0019cc2d:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc35;
            run_test_get_passwd2_cold_6();
LAB_0019cc35:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc44;
            run_test_get_passwd2_cold_7();
LAB_0019cc44:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc53;
            run_test_get_passwd2_cold_8();
          }
          aStack_2180.unused = run_test_get_group;
          run_test_get_passwd2_cold_9();
          aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc71;
          aStack_2180 = aVar6;
          iVar1 = uv_os_get_passwd(auStack_21b0);
          pcStack_21c8 = (char *)(long)iVar1;
          sStack_21d8 = 0;
          if (pcStack_21c8 == (char *)0x0) {
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc9f;
            iVar1 = uv_os_get_group(&pcStack_21c8,uStack_21a0 & 0xffffffff);
            sStack_21d8 = (size_t)iVar1;
            sStack_21d0 = 0;
            if (sStack_21d8 != 0) goto LAB_0019cd5b;
            sStack_21d8 = uStack_21a0;
            sStack_21d0 = sStack_21c0;
            if (uStack_21a0 != sStack_21c0) goto LAB_0019cd6a;
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cced;
            sStack_21d8 = strlen(pcStack_21c8);
            sStack_21d0 = 0;
            if ((long)sStack_21d8 < 1) goto LAB_0019cd79;
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd11;
            uv_os_free_group(&pcStack_21c8);
            aVar6.unused = auStack_21b0;
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd1e;
            uv_os_free_passwd(aVar6.unused);
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd28;
            iVar1 = uv_os_get_group(0,uStack_21a0 & 0xffffffff);
            sStack_21d8 = (size_t)iVar1;
            sStack_21d0 = 0xffffffffffffffea;
            if (sStack_21d8 == 0xffffffffffffffea) {
              return 0;
            }
          }
          else {
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd5b;
            run_test_get_group_cold_1();
LAB_0019cd5b:
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd6a;
            run_test_get_group_cold_2();
LAB_0019cd6a:
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd79;
            run_test_get_group_cold_3();
LAB_0019cd79:
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd88;
            run_test_get_group_cold_4();
          }
          aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd97;
          run_test_get_group_cold_5();
          iVar9 = (int)&lStack_2298;
          lStack_2290 = -0x16;
          pcStack_22a0 = (code *)0x19cdae;
          aStack_21e8 = aVar6;
          uVar7 = uv_default_loop();
          pcStack_22a0 = (code *)0x19cdca;
          iVar1 = uv_getaddrinfo(uVar7,auStack_2288,abort,0,0,0);
          lStack_2298 = (long)iVar1;
          if (lStack_2290 == lStack_2298) {
            pcStack_22a0 = (code *)0x19cde4;
            uVar7 = uv_default_loop();
            pcStack_22a0 = (code *)0x19ce05;
            iVar1 = uv_getaddrinfo(uVar7,auStack_2288,getaddrinfo_fail_cb,"example.invalid.",0,0);
            lStack_2290 = (long)iVar1;
            lStack_2298 = 0;
            if (lStack_2290 != 0) goto LAB_0019ceda;
            pcStack_22a0 = (code *)0x19ce28;
            uVar7 = uv_default_loop();
            pcStack_22a0 = (code *)0x19ce32;
            iVar1 = uv_run(uVar7,0);
            lStack_2290 = (long)iVar1;
            lStack_2298 = 0;
            if (lStack_2290 != 0) goto LAB_0019cee7;
            lStack_2290 = 1;
            lStack_2298 = (long)fail_cb_called;
            if (lStack_2298 != 1) goto LAB_0019cef4;
            pcStack_22a0 = (code *)0x19ce78;
            aVar6.unused = (void *)uv_default_loop();
            pcStack_22a0 = (code *)0x19ce8c;
            uv_walk(aVar6.unused,close_walk_cb,0);
            pcStack_22a0 = (code *)0x19ce96;
            uv_run(aVar6.unused,0);
            lStack_2290 = 0;
            pcStack_22a0 = (code *)0x19cea4;
            uVar7 = uv_default_loop();
            pcStack_22a0 = (code *)0x19ceac;
            iVar1 = uv_loop_close(uVar7);
            lStack_2298 = (long)iVar1;
            if (lStack_2290 == lStack_2298) {
              pcStack_22a0 = (code *)0x19cec2;
              uv_library_shutdown();
              return 0;
            }
          }
          else {
            pcStack_22a0 = (code *)0x19ceda;
            run_test_getaddrinfo_fail_cold_1();
LAB_0019ceda:
            pcStack_22a0 = (code *)0x19cee7;
            run_test_getaddrinfo_fail_cold_2();
LAB_0019cee7:
            pcStack_22a0 = (code *)0x19cef4;
            run_test_getaddrinfo_fail_cold_3();
LAB_0019cef4:
            pcStack_22a0 = (code *)0x19cf01;
            run_test_getaddrinfo_fail_cold_4();
          }
          pcStack_22a0 = getaddrinfo_fail_cb;
          run_test_getaddrinfo_fail_cold_5();
          pcStack_22a0 = (code *)(long)fail_cb_called;
          uStack_22a8 = 0;
          if (pcStack_22a0 == (code *)0x0) {
            pcStack_22a0 = (code *)(long)iVar9;
            uStack_22a8 = 0;
            if (-1 < (long)pcStack_22a0) goto LAB_0019cf76;
            if (extraout_RDX == 0) {
              aStack_22b8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cf5c;
              iVar1 = uv_freeaddrinfo(0);
              fail_cb_called = fail_cb_called + 1;
              return iVar1;
            }
          }
          else {
            aStack_22b8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cf76;
            getaddrinfo_fail_cb_cold_1();
LAB_0019cf76:
            aStack_22b8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cf85;
            getaddrinfo_fail_cb_cold_2();
          }
          aStack_22b8.unused = run_test_getaddrinfo_fail_sync;
          getaddrinfo_fail_cb_cold_3();
          pvStack_2360 = (void *)0x0;
          auStack_2378._8_8_ = (uv_loop_t *)0x19cfa3;
          aStack_22b8 = aVar6;
          uVar7 = uv_default_loop();
          auStack_2378._8_8_ = (uv_loop_t *)0x19cfbf;
          iVar1 = uv_getaddrinfo(uVar7,auStack_2358,0,"example.invalid.",0,0);
          auStack_2378._16_8_ = SEXT48(iVar1);
          if ((long)auStack_2378._16_8_ < (long)pvStack_2360) {
            auStack_2378._8_8_ = (uv_loop_t *)0x19cfdd;
            uv_freeaddrinfo(uStack_22c8);
            auStack_2378._8_8_ = (uv_loop_t *)0x19cfe2;
            aVar6.unused = (void *)uv_default_loop();
            auStack_2378._8_8_ = (uv_loop_t *)0x19cff6;
            uv_walk(aVar6.unused,close_walk_cb,0);
            auStack_2378._8_8_ = (uv_loop_t *)0x19d000;
            uv_run(aVar6.unused,0);
            pvStack_2360 = (void *)0x0;
            auStack_2378._8_8_ = (uv_loop_t *)0x19d00e;
            uVar7 = uv_default_loop();
            auStack_2378._8_8_ = (uv_loop_t *)0x19d016;
            iVar1 = uv_loop_close(uVar7);
            auStack_2378._16_8_ = SEXT48(iVar1);
            if (pvStack_2360 == (void *)auStack_2378._16_8_) {
              auStack_2378._8_8_ = (uv_loop_t *)0x19d02c;
              uv_library_shutdown();
              return 0;
            }
          }
          else {
            auStack_2378._8_8_ = (uv_loop_t *)0x19d044;
            run_test_getaddrinfo_fail_sync_cold_1();
          }
          auStack_2378._8_8_ = run_test_getaddrinfo_basic;
          run_test_getaddrinfo_fail_sync_cold_2();
          auStack_2378._8_8_ = aVar6;
          getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
          uVar7 = uv_default_loop();
          iVar1 = uv_getaddrinfo(uVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
          auStack_2378._0_8_ = SEXT48(iVar1);
          if ((void *)auStack_2378._0_8_ == (void *)0x0) {
            uVar7 = uv_default_loop();
            uv_run(uVar7,0);
            auStack_2378._0_8_ = (void *)0x1;
            if (getaddrinfo_cbs == 1) {
              aVar6.unused = (void *)uv_default_loop();
              uv_walk(aVar6.unused,close_walk_cb,0);
              uv_run(aVar6.unused,0);
              auStack_2378._0_8_ = (void *)0x0;
              uVar7 = uv_default_loop();
              iVar1 = uv_loop_close(uVar7);
              if ((void *)auStack_2378._0_8_ == (void *)(long)iVar1) {
                uv_library_shutdown();
                return 0;
              }
              goto LAB_0019d14c;
            }
          }
          else {
            run_test_getaddrinfo_basic_cold_1();
          }
          run_test_getaddrinfo_basic_cold_2();
LAB_0019d14c:
          __ptr = (uv_getaddrinfo_t *)auStack_2378;
          run_test_getaddrinfo_basic_cold_3();
          if (getaddrinfo_handle == __ptr) {
            getaddrinfo_cbs = getaddrinfo_cbs + 1;
            free(__ptr);
            iVar1 = uv_freeaddrinfo(extraout_RDX_00);
            return iVar1;
          }
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getaddrinfo.c"
                  ,0x36,"handle","==","getaddrinfo_handle",__ptr,"==",getaddrinfo_handle,
                  aVar6.unused);
          abort();
        }
      }
      else {
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb40;
        run_test_get_passwd2_cold_1();
LAB_0019cb40:
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb4f;
        run_test_get_passwd2_cold_2();
LAB_0019cb4f:
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb5e;
        run_test_get_passwd2_cold_3();
      }
      aVar10 = aVar5;
      aStack_2110 = aVar8;
      pcStack_2198 = "pwd2.username";
      pcVar4 = "pwd.username";
      uVar7 = 0x82;
LAB_0019cbf8:
      pcStack_2188 = "==";
      uStack_21a0 = 0x19cc06;
      aStack_2190 = aStack_2110;
      aStack_2180 = aVar10;
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
              ,uVar7,pcVar4);
      aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc0f;
      abort();
    }
  }
  else {
LAB_0019c388:
    pcStack_2040 = (char *)0x19c38d;
    run_test_get_currentexe_cold_1();
LAB_0019c38d:
    pcStack_2040 = (char *)0x19c392;
    run_test_get_currentexe_cold_18();
LAB_0019c392:
    pcStack_2040 = (char *)0x19c3a1;
    run_test_get_currentexe_cold_2();
LAB_0019c3a1:
    pcStack_2040 = (char *)0x19c3b0;
    run_test_get_currentexe_cold_3();
LAB_0019c3b0:
    pcStack_2040 = (char *)0x19c3bf;
    run_test_get_currentexe_cold_4();
LAB_0019c3bf:
    pcStack_2040 = (char *)0x19c3ce;
    run_test_get_currentexe_cold_5();
LAB_0019c3ce:
    pcStack_2040 = (char *)0x19c3dd;
    run_test_get_currentexe_cold_6();
LAB_0019c3dd:
    pcStack_2040 = (char *)0x19c3ec;
    run_test_get_currentexe_cold_7();
LAB_0019c3ec:
    pcStack_2040 = (char *)0x19c3fb;
    run_test_get_currentexe_cold_8();
LAB_0019c3fb:
    pcStack_2040 = (char *)0x19c40a;
    run_test_get_currentexe_cold_9();
LAB_0019c40a:
    pcStack_2040 = (char *)0x19c419;
    run_test_get_currentexe_cold_10();
LAB_0019c419:
    pcStack_2040 = (char *)0x19c428;
    run_test_get_currentexe_cold_16();
LAB_0019c428:
    pcStack_2040 = (char *)0x19c437;
    run_test_get_currentexe_cold_11();
LAB_0019c437:
    pcStack_2040 = (char *)0x19c446;
    run_test_get_currentexe_cold_12();
LAB_0019c446:
    pcStack_2040 = (char *)0x19c455;
    run_test_get_currentexe_cold_13();
  }
  pcVar4 = unaff_RBX;
  pcStack_2040 = (char *)0x19c45a;
  run_test_get_currentexe_cold_15();
LAB_0019c45a:
  pcStack_2048 = "==";
  pcStack_2058 = "path";
  puStack_2060 = (uv_handle_t *)0x19c49a;
  pcStack_2050 = pcVar4;
  pcStack_2040 = unaff_R14;
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
          ,0x6a,"match");
  pcStack_2040 = (char *)0x19c4a3;
  abort();
}

Assistant:

TEST_IMPL(get_currentexe) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif

  char buffer[PATHMAX];
  char path[PATHMAX];
  size_t size;
  char* match;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

#ifdef _WIN32
  snprintf(path, sizeof(path), "%s", executable_path);
#else
  ASSERT_NOT_NULL(realpath(executable_path, path));
#endif

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT_EQ(size, strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT_EQ(r, UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT_EQ(r, UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_OK(size);
  ASSERT_EQ(buffer[0], '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_EQ(1, size);
  ASSERT_NE(buffer[0], '\0');
  ASSERT_EQ(buffer[1], '\0');

  /* Verify uv_exepath is not affected by uv_set_process_title(). */
  r = uv_set_process_title("foobar");
  ASSERT_OK(r);
  size = sizeof(buffer);
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT_NOT_NULL(match);
  ASSERT_STR_EQ(match, path);
  ASSERT_EQ(size, strlen(buffer));
  return 0;
}